

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O0

void __thiscall pstack::Dwarf::Ranges::Ranges(Ranges *this,DIE *die,uintmax_t base)

{
  Unit *this_00;
  byte bVar1;
  __shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  uintmax_t uVar4;
  unsigned_long uVar5;
  Exception *pEVar6;
  Exception *pEVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  Exception local_4c8;
  unsigned_long local_328;
  uintmax_t local_320;
  uintmax_t len_1;
  uintmax_t start_3;
  uintmax_t end_1;
  uintmax_t start_2;
  unsigned_long local_2f8;
  uintmax_t local_2f0;
  uintmax_t offend;
  uintmax_t offstart;
  uintmax_t local_2d8;
  uintmax_t len;
  uintmax_t start_1;
  Exception local_2c0;
  uintmax_t local_120;
  uintmax_t baseidx;
  DW_RLE entryType;
  bool done;
  element_type *unit;
  undefined1 local_100 [7];
  uint8_t addrlen;
  undefined1 local_f0 [8];
  DWARFReader r;
  unsigned_long local_c0;
  pair<unsigned_long,_unsigned_long> local_b8;
  FormEntry *local_a8;
  uintmax_t end;
  uintmax_t start;
  undefined1 local_88 [8];
  DWARFReader reader;
  undefined1 local_50 [8];
  Attribute ranges;
  uintmax_t base_local;
  DIE *die_local;
  Ranges *this_local;
  
  ranges.formp = (FormEntry *)base;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&this->
            super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          );
  DIE::attribute((Attribute *)local_50,die,DW_AT_ranges,false);
  p_Var2 = (__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           DIE::getUnit(die);
  peVar3 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  if (peVar3->version < 5) {
    p_Var2 = (__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             DIE::getUnit(die);
    std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(p_Var2);
    Elf::Section::io((Section *)&start);
    uVar4 = DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_50);
    uVar5 = std::numeric_limits<unsigned_long>::max();
    DWARFReader::DWARFReader((DWARFReader *)local_88,(csptr *)&start,uVar4,uVar5);
    std::shared_ptr<const_pstack::Reader>::~shared_ptr((shared_ptr<const_pstack::Reader> *)&start);
    while( true ) {
      end = DWARFReader::getuint((DWARFReader *)local_88,8);
      local_a8 = (FormEntry *)DWARFReader::getuint((DWARFReader *)local_88,8);
      uVar4 = end;
      if ((end == 0) && (local_a8 == (FormEntry *)0x0)) break;
      uVar5 = std::numeric_limits<unsigned_long>::max();
      if (uVar4 == uVar5) {
        ranges.formp = local_a8;
      }
      else {
        local_c0 = (long)&(ranges.formp)->form + end;
        r._32_8_ = (long)&(ranges.formp)->form + (long)&local_a8->form;
        pVar8 = std::make_pair<unsigned_long,unsigned_long>(&local_c0,(unsigned_long *)&r.addrLen);
        local_b8 = pVar8;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)this,&local_b8);
      }
    }
    DWARFReader::~DWARFReader((DWARFReader *)local_88);
  }
  else {
    p_Var2 = (__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             DIE::getUnit(die);
    std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(p_Var2);
    Elf::Section::io((Section *)local_100);
    uVar4 = DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_50);
    uVar5 = std::numeric_limits<unsigned_long>::max();
    DWARFReader::DWARFReader((DWARFReader *)local_f0,(csptr *)local_100,uVar4,uVar5);
    std::shared_ptr<const_pstack::Reader>::~shared_ptr
              ((shared_ptr<const_pstack::Reader> *)local_100);
    p_Var2 = (__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             DIE::getUnit(die);
    peVar3 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var2);
    unit._7_1_ = peVar3->addrlen;
    p_Var2 = (__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             DIE::getUnit(die);
    _entryType = std::
                 __shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(p_Var2);
    baseidx._7_1_ = 0;
    while (((baseidx._7_1_ ^ 0xff) & 1) != 0) {
      bVar1 = DWARFReader::getu8((DWARFReader *)local_f0);
      this_00 = _entryType;
      baseidx._0_4_ = (uint)bVar1;
      switch((uint)baseidx) {
      case 0:
        baseidx._7_1_ = 1;
        break;
      case 1:
        local_120 = DWARFReader::getuleb128((DWARFReader *)local_f0);
        ranges.formp = (FormEntry *)Unit::addrx(_entryType,local_120);
        break;
      case 2:
        DWARFReader::getuleb128((DWARFReader *)local_f0);
        DWARFReader::getuleb128((DWARFReader *)local_f0);
        start_1._7_1_ = 1;
        pEVar6 = (Exception *)__cxa_allocate_exception();
        memset(&local_2c0,0,0x1a0);
        Exception::Exception(&local_2c0);
        pEVar7 = Exception::operator<<
                           (&local_2c0,(char (*) [34])"DW_RLE_startx_endx is not handled");
        Exception::Exception(pEVar6,pEVar7);
        start_1._7_1_ = 0;
        __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
      case 3:
        uVar4 = DWARFReader::getuleb128((DWARFReader *)local_f0);
        len = Unit::addrx(this_00,uVar4);
        local_2d8 = DWARFReader::getuleb128((DWARFReader *)local_f0);
        offstart = len + local_2d8;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)this,&len,&offstart);
        break;
      case 4:
        offend = DWARFReader::getuleb128((DWARFReader *)local_f0);
        local_2f0 = DWARFReader::getuleb128((DWARFReader *)local_f0);
        local_2f8 = (long)&(ranges.formp)->form + offend;
        start_2 = (long)&(ranges.formp)->form + local_2f0;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long,unsigned_long>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)this,&local_2f8,&start_2);
        break;
      case 5:
        ranges.formp = (FormEntry *)DWARFReader::getuint((DWARFReader *)local_f0,(ulong)unit._7_1_);
        break;
      case 6:
        end_1 = DWARFReader::getuint((DWARFReader *)local_f0,(ulong)unit._7_1_);
        start_3 = DWARFReader::getuint((DWARFReader *)local_f0,(ulong)unit._7_1_);
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)this,&end_1,&start_3);
        break;
      case 7:
        len_1 = DWARFReader::getuint((DWARFReader *)local_f0,(ulong)unit._7_1_);
        local_320 = DWARFReader::getuleb128((DWARFReader *)local_f0);
        local_328 = len_1 + local_320;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)this,&len_1,&local_328);
        break;
      default:
        pEVar6 = (Exception *)__cxa_allocate_exception();
        memset(&local_4c8,0,0x1a0);
        Exception::Exception(&local_4c8);
        pEVar7 = Exception::operator<<(&local_4c8,(char (*) [25])"unhandled DW_RLE_ entry ");
        pEVar7 = Exception::operator<<(pEVar7,(DW_RLE *)&baseidx);
        Exception::Exception(pEVar6,pEVar7);
        __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
      }
    }
    DWARFReader::~DWARFReader((DWARFReader *)local_f0);
  }
  DIE::Attribute::~Attribute((Attribute *)local_50);
  return;
}

Assistant:

Ranges::Ranges(const DIE &die, uintmax_t base) {

    auto ranges = die.attribute(DW_AT_ranges);

    if (die.getUnit()->version < 5) {
        // DWARF4 units use debug_ranges
        DWARFReader reader(die.getUnit()->dwarf->debugRanges.io(), uintmax_t(ranges));
        for (;;) {
            auto start = reader.getuint(sizeof (Elf::Addr));
            auto end = reader.getuint(sizeof (Elf::Addr));
            if (start == 0 && end == 0)
                break;
            if (start == std::numeric_limits<Elf::Addr>::max())
                base = end;
            else
                emplace_back(std::make_pair(start + base, end + base));
        }
    } else {
        DWARFReader r(die.getUnit()->dwarf->debugRangelists.io(), uintmax_t(ranges));

        // const auto &elf = die.getUnit()->dwarf->elf;
        // auto &addrs = elf->getDebugSection(".debug_addr", SHT_NULL); // XXX: would be used by the "x" ops below

        auto addrlen = die.getUnit()->addrlen;
        auto &unit = *die.getUnit();
        for (bool done = false; !done;) {
            auto entryType = DW_RLE(r.getu8());
            switch (entryType) {
                case DW_RLE_end_of_list:
                    done = true;
                    break;

                case DW_RLE_base_addressx: {
                    auto baseidx = r.getuleb128();
                    base = unit.addrx(baseidx);
                    break;
                }

                case DW_RLE_startx_endx: {
                    /* auto startx = */ r.getuleb128();
                    /* auto endx = */ r.getuleb128();
                    throw (Exception() << "DW_RLE_startx_endx is not handled");
                }

                case DW_RLE_startx_length: {
                    auto start = unit.addrx(r.getuleb128());
                    auto len = r.getuleb128();
                    emplace_back(start, start + len);
                    break;
                }

                case DW_RLE_offset_pair: {
                    auto offstart = r.getuleb128();
                    auto offend = r.getuleb128();
                    emplace_back(offstart + base, offend + base);
                    break;
                }

                case DW_RLE_base_address:
                    base = r.getuint(addrlen);
                    break;

                case DW_RLE_start_end: {
                    auto start = r.getuint(addrlen);
                    auto end = r.getuint(addrlen);
                    emplace_back(start, end);
                    break;
                }
                case DW_RLE_start_length: {
                    auto start = r.getuint(addrlen);
                    auto len = r.getuleb128();
                    emplace_back(start, start + len);
                    break;
                }
                default:
                    throw (Exception() << "unhandled DW_RLE_ entry " << entryType);
            }
        }
    }
}